

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O3

c_float compute_rho_estimate(OSQPWorkspace *work)

{
  double dVar1;
  c_int l;
  c_int l_00;
  c_float cVar2;
  c_float cVar3;
  c_float cVar4;
  c_float cVar5;
  c_float cVar6;
  c_float cVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  l = work->data->n;
  l_00 = work->data->m;
  cVar2 = vec_norm_inf(work->z_prev,l_00);
  cVar3 = vec_norm_inf(work->x_prev,l);
  cVar4 = vec_norm_inf(work->z,l_00);
  cVar5 = vec_norm_inf(work->Ax,l_00);
  cVar6 = vec_norm_inf(work->data->q,l);
  cVar7 = vec_norm_inf(work->Aty,l);
  if (cVar6 <= cVar7) {
    cVar6 = cVar7;
  }
  cVar7 = vec_norm_inf(work->Px,l);
  auVar9._8_8_ = cVar6;
  auVar9._0_8_ = cVar4;
  auVar10._8_8_ = cVar7;
  auVar10._0_8_ = cVar5;
  auVar10 = maxpd(auVar9,auVar10);
  auVar11._8_8_ = cVar3;
  auVar11._0_8_ = cVar2;
  auVar12._8_8_ = auVar10._8_8_ + 1e-10;
  auVar12._0_8_ = auVar10._0_8_ + 1e-10;
  auVar12 = divpd(auVar11,auVar12);
  dVar1 = work->settings->rho;
  dVar8 = auVar12._0_8_ / (auVar12._8_8_ + 1e-10);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  cVar6 = dVar1 * dVar8;
  if (cVar6 <= 1e-06) {
    cVar6 = 1e-06;
  }
  if (1000000.0 <= cVar6) {
    cVar6 = 1000000.0;
  }
  return cVar6;
}

Assistant:

c_float compute_rho_estimate(OSQPWorkspace *work) {
  c_int   n, m;                       // Dimensions
  c_float pri_res, dua_res;           // Primal and dual residuals
  c_float pri_res_norm, dua_res_norm; // Normalization for the residuals
  c_float temp_res_norm;              // Temporary residual norm
  c_float rho_estimate;               // Rho estimate value

  // Get problem dimensions
  n = work->data->n;
  m = work->data->m;

  // Get primal and dual residuals
  pri_res = vec_norm_inf(work->z_prev, m);
  dua_res = vec_norm_inf(work->x_prev, n);

  // Normalize primal residual
  pri_res_norm  = vec_norm_inf(work->z, m);           // ||z||
  temp_res_norm = vec_norm_inf(work->Ax, m);          // ||Ax||
  pri_res_norm  = c_max(pri_res_norm, temp_res_norm); // max (||z||,||Ax||)
  pri_res      /= (pri_res_norm + 1e-10);             // Normalize primal
                                                      // residual (prevent 0
                                                      // division)

  // Normalize dual residual
  dua_res_norm  = vec_norm_inf(work->data->q, n);     // ||q||
  temp_res_norm = vec_norm_inf(work->Aty, n);         // ||A' y||
  dua_res_norm  = c_max(dua_res_norm, temp_res_norm);
  temp_res_norm = vec_norm_inf(work->Px, n);          //  ||P x||
  dua_res_norm  = c_max(dua_res_norm, temp_res_norm); // max(||q||,||A' y||,||P
                                                      // x||)
  dua_res      /= (dua_res_norm + 1e-10);             // Normalize dual residual
                                                      // (prevent 0 division)


  // Return rho estimate
  rho_estimate = work->settings->rho * c_sqrt(pri_res / (dua_res + 1e-10)); // (prevent
                                                                            // 0
                                                                            // division)
  rho_estimate = c_min(c_max(rho_estimate, RHO_MIN), RHO_MAX);              // Constrain
                                                                            // rho
                                                                            // values
  return rho_estimate;
}